

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<void> __thiscall kj::anon_unknown_77::AsyncTee::pull(AsyncTee *this)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *pTVar2;
  EagerPromiseNode<kj::_::Void> *pEVar3;
  EagerPromiseNode<kj::_::Void> *extraout_RDX;
  EagerPromiseNode<kj::_::Void> *extraout_RDX_00;
  EagerPromiseNode<kj::_::Void> *extraout_RDX_01;
  Disposer *in_RSI;
  Own<kj::_::ChainPromiseNode> OVar4;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar5;
  Promise<void> PVar6;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  undefined4 local_28;
  undefined4 uStack_24;
  uint uStack_20;
  undefined4 uStack_1c;
  
  _::yield();
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,&local_38,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1568:22),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00468b90;
  pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_RSI;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncTee::pull()::{lambda()#1},kj::_::PropagateException>>
        ::instance;
  local_68.ptr = (PromiseNode *)pTVar2;
  OVar4 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_28,&local_68);
  pPVar1 = local_68.ptr;
  local_58.disposer._0_4_ = local_28;
  local_58.disposer._4_4_ = uStack_24;
  local_58.ptr = (PromiseNode *)CONCAT44(uStack_1c,uStack_20);
  if ((TransformPromiseNodeBase *)local_68.ptr != (TransformPromiseNodeBase *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    (**(local_68.disposer)->_vptr_Disposer)
              (local_68.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar4.ptr);
  }
  pPVar1 = local_38.ptr;
  if (local_38.ptr != (PromiseNode *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    (**(local_38.disposer)->_vptr_Disposer)
              (local_38.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,&local_58,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1583:13),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00468c18;
  pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_RSI;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncTee::pull()::{lambda()#2},kj::_::PropagateException>>
        ::instance;
  local_68.ptr = (PromiseNode *)pTVar2;
  OVar4 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_28,&local_68);
  pPVar1 = local_68.ptr;
  local_48.disposer._0_4_ = local_28;
  local_48.disposer._4_4_ = uStack_24;
  local_48.ptr = (PromiseNode *)CONCAT44(uStack_1c,uStack_20);
  if ((TransformPromiseNodeBase *)local_68.ptr != (TransformPromiseNodeBase *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    (**(local_68.disposer)->_vptr_Disposer)
              (local_68.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar4.ptr);
  }
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,&local_48,_::IdentityFunc<void>::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00468d28;
  pTVar2[1].dependency.disposer = in_RSI;
  local_68.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::AsyncTee::pull()::{lambda(kj::Exception&&)#1}>>
        ::instance;
  local_68.ptr = (PromiseNode *)pTVar2;
  OVar5 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)&local_28,&local_68);
  pPVar1 = local_68.ptr;
  pEVar3 = OVar5.ptr;
  *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer = local_28;
  *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) = uStack_24;
  (this->super_Refcounted).refcount = uStack_20;
  *(undefined4 *)&(this->super_Refcounted).field_0xc = uStack_1c;
  if ((TransformPromiseNodeBase *)local_68.ptr != (TransformPromiseNodeBase *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    (**(local_68.disposer)->_vptr_Disposer)
              (local_68.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    pEVar3 = extraout_RDX;
  }
  pPVar1 = local_48.ptr;
  if (local_48.ptr != (PromiseNode *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_48.disposer._4_4_,local_48.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_48.disposer._4_4_,local_48.disposer._0_4_),
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pEVar3 = extraout_RDX_00;
  }
  pPVar1 = local_58.ptr;
  if (local_58.ptr != (PromiseNode *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_58.disposer._4_4_,local_58.disposer._0_4_),
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pEVar3 = extraout_RDX_01;
  }
  PVar6.super_PromiseBase.node.ptr = (PromiseNode *)pEVar3;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar6.super_PromiseBase.node;
}

Assistant:

Promise<void> pull() {
    // Use evalLater() so that two pump sinks added on the same turn of the event loop will not
    // cause buffering.
    return evalLater([this] {
      // Attempt to fill any sinks that exist.

      Vector<Promise<void>> promises;

      for (auto& state: branches) {
        KJ_IF_MAYBE(s, state) {
          KJ_IF_MAYBE(sink, s->sink) {
            promises.add(sink->fill(s->buffer, stoppage));
          }
        }
      }

      // Respect the greatest of the sinks' backpressures.
      return joinPromises(promises.releaseAsArray());
    }).then([this]() -> Promise<void> {
      // Check to see whether we need to perform an inner read.

      auto need = analyzeSinks();

      if (need == nullptr) {
        // No more sinks, stop pulling.
        pulling = false;
        return READY_NOW;
      }

      if (stoppage != nullptr) {
        // We're eof or errored, don't read, but loop so we can fill the sink(s).
        return pull();
      }

      auto& n = KJ_ASSERT_NONNULL(need);

      KJ_ASSERT(n.minBytes > 0);

      // We must perform an inner read.

      // We'd prefer not to explode our buffer, if that's cool. We cap `maxBytes` to the buffer size
      // limit or our builtin MAX_BLOCK_SIZE, whichever is smaller. But, we make sure `maxBytes` is
      // still >= `minBytes`.
      n.maxBytes = kj::min(n.maxBytes, MAX_BLOCK_SIZE);
      n.maxBytes = kj::min(n.maxBytes, bufferSizeLimit);
      n.maxBytes = kj::max(n.minBytes, n.maxBytes);
      for (auto& state: branches) {
        KJ_IF_MAYBE(s, state) {
          // TODO(perf): buffer.size() is O(n) where n = # of individual heap-allocated byte arrays.
          if (s->buffer.size() + n.maxBytes > bufferSizeLimit) {
            stoppage = Stoppage(KJ_EXCEPTION(FAILED, "tee buffer size limit exceeded"));
            return pull();
          }
        }
      }
      auto heapBuffer = heapArray<byte>(n.maxBytes);

      // gcc 4.9 quirk: If I don't hoist this into a separate variable and instead call
      //
      //   inner->tryRead(heapBuffer.begin(), n.minBytes, heapBuffer.size())
      //
      // `heapBuffer` seems to get moved into the lambda capture before the arguments to `tryRead()`
      // are evaluated, meaning `inner` sees a nullptr destination. Bizarrely, `inner` sees the
      // correct value for `heapBuffer.size()`... I dunno, man.
      auto destination = heapBuffer.begin();

      try {
        return inner->tryRead(destination, n.minBytes, n.maxBytes)
            .then([this, heapBuffer = mv(heapBuffer), minBytes = n.minBytes](size_t amount) mutable
                -> Promise<void> {
          length = length.map([amount](uint64_t n) {
            KJ_ASSERT(n >= amount);
            return n - amount;
          });

          if (amount < heapBuffer.size()) {
            heapBuffer = heapBuffer.slice(0, amount).attach(mv(heapBuffer));
          }

          KJ_ASSERT(stoppage == nullptr);
          Maybe<ArrayPtr<byte>> bufferPtr = nullptr;
          for (auto& state: branches) {
            KJ_IF_MAYBE(s, state) {
              // Prefer to move the buffer into the receiving branch's deque, rather than memcpy.
              //
              // TODO(perf): For the 2-branch case, this is fine, since the majority of the time
              //   only one buffer will be in use. If we generalize to the n-branch case, this would
              //   become memcpy-heavy.
              KJ_IF_MAYBE(ptr, bufferPtr) {
                s->buffer.produce(heapArray(*ptr));
              } else {
                bufferPtr = ArrayPtr<byte>(heapBuffer);
                s->buffer.produce(mv(heapBuffer));
              }
            }
          }

          if (amount < minBytes) {
            // Short read, EOF.
            stoppage = Stoppage(Eof());
          }

          return pull();
        }, [this](Exception&& exception) {
          // Exception from the inner tryRead(). Propagate.
          stoppage = Stoppage(mv(exception));
          return pull();
        });
      }